

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O3

void __thiscall QPrintDialogPrivate::_q_collapseOrExpandDialog(QPrintDialogPrivate *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  QSize *pQVar4;
  QWidget *pQVar5;
  QPushButton *pQVar6;
  long lVar7;
  QSize QVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long in_FS_OFFSET;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = *(QSize **)&(this->super_QAbstractPrintDialogPrivate).field_0x8;
  pQVar5 = this->bottom;
  pQVar6 = this->collapseButton;
  if ((*(byte *)(*(long *)(pQVar5 + 0x20) + 9) & 0x80) == 0) {
    QMetaObject::tr((char *)local_50,(char *)&QPrintDialog::staticMetaObject,0x157fb7);
    QAbstractButton::setText((QString *)pQVar6);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    iVar11 = 1;
  }
  else {
    QMetaObject::tr((char *)local_50,(char *)&QPrintDialog::staticMetaObject,0x157f3d);
    QAbstractButton::setText((QString *)pQVar6);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    iVar9 = QWidget::y();
    iVar11 = *(int *)(*(long *)(pQVar5 + 0x20) + 0x18);
    iVar3 = *(int *)(*(long *)(pQVar5 + 0x20) + 0x20);
    iVar10 = QWidget::y();
    lVar7 = *(long *)&this->top->field_0x20;
    iVar11 = ((iVar10 + (iVar11 - (iVar9 + iVar3)) + *(int *)(lVar7 + 0x20)) -
             *(int *)(lVar7 + 0x18)) + 1;
  }
  (**(code **)(*(long *)pQVar5 + 0x68))(pQVar5,-1 < *(short *)(*(long *)(pQVar5 + 0x20) + 8));
  if ((*(byte *)(*(long *)(pQVar5 + 0x20) + 9) & 0x80) == 0) {
    QWidget::layout();
    QLayout::activate();
    QVar8 = pQVar4[4];
    uVar1 = *(undefined8 *)((long)QVar8 + 0x1c);
    uVar2 = *(undefined8 *)((long)QVar8 + 0x14);
    local_50[0] = (QArrayData *)
                  CONCAT44((iVar11 + (int)((ulong)uVar1 >> 0x20)) - (int)((ulong)uVar2 >> 0x20),
                           ((int)uVar1 + 1) - (int)uVar2);
    QWidget::resize(pQVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintDialogPrivate::_q_collapseOrExpandDialog()
{
    int collapseHeight = 0;
    Q_Q(QPrintDialog);
    QWidget *widgetToHide = bottom;
    if (widgetToHide->isVisible()) {
        collapseButton->setText(QPrintDialog::tr("&Options >>"));
        collapseHeight = widgetToHide->y() + widgetToHide->height() - (top->y() + top->height());
    }
    else
        collapseButton->setText(QPrintDialog::tr("&Options <<"));
    widgetToHide->setVisible(! widgetToHide->isVisible());
    if (! widgetToHide->isVisible()) { // make it shrink
        q->layout()->activate();
        q->resize( QSize(q->width(), q->height() - collapseHeight) );
    }
}